

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

QByteArray * __thiscall QHttpNetworkRequest::methodName(QHttpNetworkRequest *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  QByteArray *in_RDI;
  QByteArray *in_stack_ffffffffffffffc8;
  QByteArray *this_00;
  
  this_00 = in_RDI;
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x3093f2);
  switch(pQVar1->operation) {
  case Options:
    QByteArray::QByteArray(this_00,"OPTIONS",-1);
    break;
  case Get:
    QByteArray::QByteArray(this_00,"GET",-1);
    break;
  case Head:
    QByteArray::QByteArray(this_00,"HEAD",-1);
    break;
  case Post:
    QByteArray::QByteArray(this_00,"POST",-1);
    break;
  case Put:
    QByteArray::QByteArray(this_00,"PUT",-1);
    break;
  case Delete:
    QByteArray::QByteArray(this_00,"DELETE",-1);
    break;
  case Trace:
    QByteArray::QByteArray(this_00,"TRACE",-1);
    break;
  case Connect:
    QByteArray::QByteArray(this_00,"CONNECT",-1);
    break;
  case Custom:
    QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
              ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x309504);
    QByteArray::QByteArray(this_00,in_stack_ffffffffffffffc8);
    break;
  default:
    QByteArray::QByteArray((QByteArray *)0x309523);
  }
  return in_RDI;
}

Assistant:

QByteArray QHttpNetworkRequest::methodName() const
{
    switch (d->operation) {
    case QHttpNetworkRequest::Get:
        return "GET";
    case QHttpNetworkRequest::Head:
        return "HEAD";
    case QHttpNetworkRequest::Post:
        return "POST";
    case QHttpNetworkRequest::Options:
        return "OPTIONS";
    case QHttpNetworkRequest::Put:
        return "PUT";
    case QHttpNetworkRequest::Delete:
        return "DELETE";
    case QHttpNetworkRequest::Trace:
        return "TRACE";
    case QHttpNetworkRequest::Connect:
        return "CONNECT";
    case QHttpNetworkRequest::Custom:
        return d->customVerb;
    default:
        break;
    }
    return QByteArray();
}